

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O3

void __thiscall DIS::IFFPdu::marshal(IFFPdu *this,DataStream *dataStream)

{
  pointer pIVar1;
  ulong uVar2;
  long lVar3;
  IFFFundamentalParameterData x;
  IFFFundamentalParameterData local_50;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  Vector3Float::marshal(&this->_relativeAntennaLocation,dataStream);
  SystemIdentifier::marshal(&this->_systemID,dataStream);
  DataStream::operator<<(dataStream,this->_systemDesignator);
  DataStream::operator<<(dataStream,this->_systemSpecificData);
  FundamentalOperationalData::marshal(&this->_fundamentalOperationalData,dataStream);
  LayerHeader::marshal(&this->_layerHeader,dataStream);
  BeamData::marshal(&this->_beamData,dataStream);
  SecondaryOperationalData::marshal(&this->_secondaryOperationalData,dataStream);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_iffParameters).
                                     super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_iffParameters).
                                    super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5));
  pIVar1 = (this->_iffParameters).
           super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_iffParameters).
      super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_50._vptr_IFFFundamentalParameterData =
           (_func_int **)&PTR__IFFFundamentalParameterData_001b4e18;
      local_50._24_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar3 + -0xd);
      local_50._8_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar3 + -0x1d);
      local_50._16_8_ = *(undefined8 *)(pIVar1->_systemSpecificData + lVar3 + -0x1d + 8);
      IFFFundamentalParameterData::marshal(&local_50,dataStream);
      IFFFundamentalParameterData::~IFFFundamentalParameterData(&local_50);
      uVar2 = uVar2 + 1;
      pIVar1 = (this->_iffParameters).
               super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < (ulong)((long)(this->_iffParameters).
                                   super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 5));
  }
  return;
}

Assistant:

void IFFPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    _relativeAntennaLocation.marshal(dataStream);
    _systemID.marshal(dataStream);
    dataStream << _systemDesignator;
    dataStream << _systemSpecificData;
    _fundamentalOperationalData.marshal(dataStream);
    _layerHeader.marshal(dataStream);
    _beamData.marshal(dataStream);
    _secondaryOperationalData.marshal(dataStream);
    dataStream << ( unsigned char )_iffParameters.size();
    for(size_t idx = 0; idx < _iffParameters.size(); idx++)
    {
        IFFFundamentalParameterData x = _iffParameters[idx];
        x.marshal(dataStream);
    }

}